

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ops_sse.h
# Opt level: O0

void helper_packssdw_xmm_x86_64(CPUX86State *env,ZMMReg *d,ZMMReg *s)

{
  int iVar1;
  undefined2 local_60;
  undefined2 local_5e;
  undefined2 local_5c;
  undefined2 local_5a;
  ZMMReg r;
  ZMMReg *s_local;
  ZMMReg *d_local;
  CPUX86State *env_local;
  
  r._q_ZMMReg[7] = (uint64_t)s;
  s_local = d;
  d_local = (ZMMReg *)env;
  iVar1 = satsw(d->_l_ZMMReg[0]);
  local_60 = (undefined2)iVar1;
  iVar1 = satsw(s_local->_l_ZMMReg[1]);
  local_5e = (undefined2)iVar1;
  iVar1 = satsw(s_local->_l_ZMMReg[2]);
  local_5c = (undefined2)iVar1;
  iVar1 = satsw(s_local->_l_ZMMReg[3]);
  local_5a = (undefined2)iVar1;
  iVar1 = satsw(*(int *)r._q_ZMMReg[7]);
  r._w_ZMMReg[0] = (uint16_t)iVar1;
  iVar1 = satsw(*(int *)(r._q_ZMMReg[7] + 4));
  r._w_ZMMReg[1] = (uint16_t)iVar1;
  iVar1 = satsw(*(int *)(r._q_ZMMReg[7] + 8));
  r._w_ZMMReg[2] = (uint16_t)iVar1;
  iVar1 = satsw(*(int *)(r._q_ZMMReg[7] + 0xc));
  r._w_ZMMReg[3] = (uint16_t)iVar1;
  memcpy(s_local,&local_60,0x40);
  return;
}

Assistant:

void glue(helper_packssdw, SUFFIX)(CPUX86State *env, Reg *d, Reg *s)
{
    Reg r;

    r.W(0) = satsw(d->L(0));
    r.W(1) = satsw(d->L(1));
#if SHIFT == 1
    r.W(2) = satsw(d->L(2));
    r.W(3) = satsw(d->L(3));
#endif
    r.W((2 << SHIFT) + 0) = satsw(s->L(0));
    r.W((2 << SHIFT) + 1) = satsw(s->L(1));
#if SHIFT == 1
    r.W(6) = satsw(s->L(2));
    r.W(7) = satsw(s->L(3));
#endif
    *d = r;
}